

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_move_from_roaring32(void **param_1)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring64_bitmap_t *prVar3;
  uint64_t a;
  undefined8 local_38;
  undefined8 uStack_30;
  
  prVar2 = (roaring_bitmap_t *)roaring_bitmap_create();
  prVar3 = roaring64_bitmap_move_from_roaring32((roaring_bitmap_t *)prVar2);
  assert_r32_valid(prVar2);
  _Var1 = roaring_bitmap_is_empty((roaring_bitmap_t *)prVar2);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(r32)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x7c);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  _Var1 = roaring64_bitmap_is_empty(prVar3);
  _assert_true((ulong)_Var1,"roaring64_bitmap_is_empty(r)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x7e);
  roaring64_bitmap_free(prVar3);
  roaring_bitmap_free((roaring_bitmap_t *)prVar2);
  local_38 = 0;
  uStack_30 = 0xffffffff00000064;
  prVar2 = (roaring_bitmap_t *)roaring_bitmap_of_ptr(3,(uint32_t *)((long)&local_38 + 4));
  prVar3 = roaring64_bitmap_move_from_roaring32((roaring_bitmap_t *)prVar2);
  assert_r32_valid(prVar2);
  _Var1 = roaring_bitmap_is_empty((roaring_bitmap_t *)prVar2);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(r32)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x88);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  a = roaring64_bitmap_get_cardinality(prVar3);
  _assert_int_equal(a,3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x8a);
  _Var1 = roaring64_bitmap_contains(prVar3,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x8c);
  _Var1 = roaring64_bitmap_contains(prVar3,100);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 100)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x8d);
  _Var1 = roaring64_bitmap_contains(prVar3,0xffffffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x8e);
  roaring_bitmap_free((roaring_bitmap_t *)prVar2);
  roaring64_bitmap_free(prVar3);
  return;
}

Assistant:

DEFINE_TEST(test_move_from_roaring32) {
    {
        // Empty bitmap
        roaring_bitmap_t* r32 = roaring_bitmap_create();
        roaring64_bitmap_t* r = roaring64_bitmap_move_from_roaring32(r32);

        assert_r32_valid(r32);
        assert_true(roaring_bitmap_is_empty(r32));
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_is_empty(r));

        roaring64_bitmap_free(r);
        roaring_bitmap_free(r32);
    }
    {
        roaring_bitmap_t* r32 = roaring_bitmap_from(0, 100, UINT32_MAX);
        roaring64_bitmap_t* r = roaring64_bitmap_move_from_roaring32(r32);

        assert_r32_valid(r32);
        assert_true(roaring_bitmap_is_empty(r32));
        assert_r64_valid(r);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 3);

        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 100));
        assert_true(roaring64_bitmap_contains(r, UINT32_MAX));

        roaring_bitmap_free(r32);
        roaring64_bitmap_free(r);
    }
}